

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AC3DImporter::ConvertMaterial
          (AC3DImporter *this,Object *object,Material *matSrc,aiMaterial *matDest)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  float local_448;
  int local_444;
  float f;
  int n;
  aiUVTransform transform;
  aiString s;
  aiMaterial *matDest_local;
  Material *matSrc_local;
  Object *object_local;
  AC3DImporter *this_local;
  
  aiString::aiString((aiString *)&transform.mScaling.y);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    aiString::Set((aiString *)&transform.mScaling.y,&matSrc->name);
    aiMaterial::AddProperty(matDest,(aiString *)&transform.mScaling.y,"?mat.name",0,0);
  }
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    aiString::Set((aiString *)&transform.mScaling.y,&object->texture);
    aiMaterial::AddProperty(matDest,(aiString *)&transform.mScaling.y,"$tex.file",1,0);
    if ((((((object->texRepeat).x != 1.0) || (NAN((object->texRepeat).x))) ||
         (pfVar1 = &(object->texRepeat).y, *pfVar1 != 1.0)) ||
        ((NAN(*pfVar1) || (fVar2 = (object->texOffset).x, fVar2 != 0.0)))) ||
       ((NAN(fVar2) || ((fVar2 = (object->texOffset).y, fVar2 != 0.0 || (NAN(fVar2))))))) {
      aiUVTransform::aiUVTransform((aiUVTransform *)&f);
      transform.mTranslation = object->texRepeat;
      _f = object->texOffset;
      aiMaterial::AddProperty(matDest,(aiUVTransform *)&f,1,"$tex.uvtrafo",1,0);
    }
  }
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->rgb,1,"$clr.diffuse",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->amb,1,"$clr.ambient",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->emis,1,"$clr.emissive",0,0);
  aiMaterial::AddProperty<aiColor3D>(matDest,&matSrc->spec,1,"$clr.specular",0,0);
  if ((matSrc->shin != 0.0) || (NAN(matSrc->shin))) {
    local_444 = 3;
    aiMaterial::AddProperty<float>(matDest,&matSrc->shin,1,"$mat.shininess",0,0);
  }
  else {
    local_444 = 2;
  }
  aiMaterial::AddProperty<int>(matDest,&local_444,1,"$mat.shadingm",0,0);
  local_448 = 1.0 - matSrc->trans;
  aiMaterial::AddProperty<float>(matDest,&local_448,1,"$mat.opacity",0,0);
  return;
}

Assistant:

void AC3DImporter::ConvertMaterial(const Object& object,
    const Material& matSrc,
    aiMaterial& matDest)
{
    aiString s;

    if (matSrc.name.length())
    {
        s.Set(matSrc.name);
        matDest.AddProperty(&s,AI_MATKEY_NAME);
    }
    if (object.texture.length())
    {
        s.Set(object.texture);
        matDest.AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // UV transformation
        if (1.f != object.texRepeat.x || 1.f != object.texRepeat.y ||
            object.texOffset.x        || object.texOffset.y)
        {
            aiUVTransform transform;
            transform.mScaling = object.texRepeat;
            transform.mTranslation = object.texOffset;
            matDest.AddProperty(&transform,1,AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
        }
    }

    matDest.AddProperty<aiColor3D>(&matSrc.rgb,1, AI_MATKEY_COLOR_DIFFUSE);
    matDest.AddProperty<aiColor3D>(&matSrc.amb,1, AI_MATKEY_COLOR_AMBIENT);
    matDest.AddProperty<aiColor3D>(&matSrc.emis,1,AI_MATKEY_COLOR_EMISSIVE);
    matDest.AddProperty<aiColor3D>(&matSrc.spec,1,AI_MATKEY_COLOR_SPECULAR);

    int n;
    if (matSrc.shin)
    {
        n = aiShadingMode_Phong;
        matDest.AddProperty<float>(&matSrc.shin,1,AI_MATKEY_SHININESS);
    }
    else n = aiShadingMode_Gouraud;
    matDest.AddProperty<int>(&n,1,AI_MATKEY_SHADING_MODEL);

    float f = 1.f - matSrc.trans;
    matDest.AddProperty<float>(&f,1,AI_MATKEY_OPACITY);
}